

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O1

int Wildcard::wildcardfit(char *wildcard,char *test)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char *local_20;
  char *local_18;
  
  cVar4 = *wildcard;
  uVar2 = 1;
  pcVar1 = wildcard;
  local_18 = test;
  if (cVar4 != '\0') {
    cVar5 = *test;
    pcVar1 = wildcard;
    if (cVar5 != '\0') {
      local_20 = wildcard;
      do {
        if (cVar4 == '*') {
          uVar2 = asterisk(&local_20,&local_18);
          local_20 = local_20 + -1;
        }
        else if (cVar4 == '?') {
          local_18 = local_18 + 1;
          uVar2 = 1;
        }
        else if (cVar4 == '[') {
          local_20 = local_20 + 1;
          uVar2 = set(&local_20,&local_18);
        }
        else {
          uVar2 = (uint)(cVar4 == cVar5);
          local_18 = local_18 + 1;
        }
        pcVar1 = local_20 + 1;
        if ((uVar2 == 0) || (cVar4 = local_20[1], cVar4 == '\0')) break;
        cVar5 = *local_18;
        local_20 = pcVar1;
      } while (cVar5 != '\0');
    }
  }
  local_20 = pcVar1;
  local_20 = local_20 + -1;
  do {
    pcVar1 = local_20 + 1;
    local_20 = local_20 + 1;
  } while (((byte)uVar2 & *pcVar1 == '*') != 0);
  uVar3 = 0;
  if (((byte)uVar2 != 0) && (*local_18 == '\0')) {
    uVar3 = (uint)(*pcVar1 == '\0');
  }
  return uVar3;
}

Assistant:

int Wildcard::wildcardfit(const char* wildcard, const char* test) {
  int fit = 1;

  for (; ('\000' != *wildcard) && (1 == fit) && ('\000' != *test); wildcard++) {
    switch (*wildcard) {
    case '[':
      wildcard++; /* leave out the opening square bracket */
      fit = set(&wildcard, &test);
      /* we don't need to decrement the wildcard as in case */
      /* of asterisk because the closing ] is still there */
      break;
    case '?':
      test++;
      break;
    case '*':
      fit = asterisk(&wildcard, &test);
      /* the asterisk was skipped by asterisk() but the loop will */
      /* increment by itself. So we have to decrement */
      wildcard--;
      break;
    default:
      fit = (int)(*wildcard == *test);
      test++;
    }
  }
  while ((*wildcard == '*') && (1 == fit))
    /* here the teststring is empty otherwise you cannot */
    /* leave the previous loop */
    wildcard++;
  return (int)((1 == fit) && ('\0' == *test) && ('\0' == *wildcard));
}